

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilderAsmJs.cpp
# Opt level: O3

void __thiscall
IRBuilderAsmJs::BuildArgOut
          (IRBuilderAsmJs *this,Opnd *srcOpnd,uint32 dstRegSlot,uint32 offset,IRType type,
          ValueType valueType)

{
  RealCount *pRVar1;
  SListCounted<IR::Instr_*,_Memory::ArenaAllocator> *pSVar2;
  code *pcVar3;
  bool bVar4;
  StackSym *sym;
  StackSym *sym_00;
  RegOpnd *dstOpnd;
  Instr *pIVar5;
  undefined4 *puVar6;
  SymOpnd *this_00;
  Type pSVar7;
  uint uVar8;
  ValueType local_32 [4];
  ValueType valueType_local;
  
  if (dstRegSlot < 0x10000) {
    if (type == TyVar) {
      if ((short)dstRegSlot == -1) {
        Math::DefaultOverflowPolicy();
      }
      sym = SymTable::GetArgSlotSym(this->m_func->m_symTable,(short)dstRegSlot + 1);
      sym_00 = StackSym::New(this->m_func);
      dstOpnd = IR::RegOpnd::New(sym_00,TyVar,this->m_func);
      pIVar5 = IR::Instr::New(ToVar,&dstOpnd->super_Opnd,srcOpnd,this->m_func);
      AddInstr(this,pIVar5,offset);
      srcOpnd = &dstOpnd->super_Opnd;
    }
    else {
      uVar8 = (this->m_argStack->super_SList<IR::Instr_*,_Memory::ArenaAllocator,_RealCount>).
              super_SListBase<IR::Instr_*,_Memory::ArenaAllocator,_RealCount>.super_RealCount.count;
      if ((dstRegSlot & 0xffff) < uVar8) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar6 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilderAsmJs.cpp"
                           ,0x7eb,"(dstArgSlot >= m_argStack->Count())",
                           "dstArgSlot >= m_argStack->Count()");
        if (!bVar4) goto LAB_004f878d;
        *puVar6 = 0;
        uVar8 = (this->m_argStack->super_SList<IR::Instr_*,_Memory::ArenaAllocator,_RealCount>).
                super_SListBase<IR::Instr_*,_Memory::ArenaAllocator,_RealCount>.super_RealCount.
                count;
      }
      if (0xfffe < uVar8) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar6 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilderAsmJs.cpp"
                           ,0x7ed,"(slotIndex < (65535))","slotIndex < (65535)");
        if (!bVar4) goto LAB_004f878d;
        *puVar6 = 0;
      }
      sym = StackSym::NewArgSlotSym((ArgSlot)uVar8,this->m_func,type);
      sym->field_0x19 = sym->field_0x19 | 0x10;
    }
    this_00 = IR::SymOpnd::New(&sym->super_Sym,type,this->m_func);
    bVar4 = ValueType::IsUninitialized(local_32);
    if (!bVar4) {
      IR::Opnd::SetValueType(&this_00->super_Opnd,valueType);
    }
    pIVar5 = IR::Instr::New(ArgOut_A,&this_00->super_Opnd,srcOpnd,this->m_func);
    AddInstr(this,pIVar5,offset);
    pSVar2 = this->m_argStack;
    pSVar7 = (Type)new<Memory::ArenaAllocator>
                             (0x10,(pSVar2->
                                   super_SList<IR::Instr_*,_Memory::ArenaAllocator,_RealCount>).
                                   allocator,0x364470);
    pSVar7[1].next = (Type)pIVar5;
    pSVar7->next = (pSVar2->super_SList<IR::Instr_*,_Memory::ArenaAllocator,_RealCount>).
                   super_SListBase<IR::Instr_*,_Memory::ArenaAllocator,_RealCount>.
                   super_SListNodeBase<Memory::ArenaAllocator>.next;
    (pSVar2->super_SList<IR::Instr_*,_Memory::ArenaAllocator,_RealCount>).
    super_SListBase<IR::Instr_*,_Memory::ArenaAllocator,_RealCount>.
    super_SListNodeBase<Memory::ArenaAllocator>.next = pSVar7;
    pRVar1 = &(pSVar2->super_SList<IR::Instr_*,_Memory::ArenaAllocator,_RealCount>).
              super_SListBase<IR::Instr_*,_Memory::ArenaAllocator,_RealCount>.super_RealCount;
    pRVar1->count = pRVar1->count + 1;
    return;
  }
  AssertCount = AssertCount + 1;
  Js::Throw::LogAssert();
  puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
  *puVar6 = 1;
  bVar4 = Js::Throw::ReportAssert
                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilderAsmJs.cpp"
                     ,0x7db,"((0))","Arg count too big...");
  if (bVar4) {
    *puVar6 = 0;
    Js::Throw::FatalInternalError(-0x7fffbffb);
  }
LAB_004f878d:
  pcVar3 = (code *)invalidInstructionException();
  (*pcVar3)();
}

Assistant:

void IRBuilderAsmJs::BuildArgOut(IR::Opnd* srcOpnd, uint32 dstRegSlot, uint32 offset, IRType type, ValueType valueType)
{
    Js::ArgSlot dstArgSlot = (Js::ArgSlot)dstRegSlot;
    if ((uint32)dstArgSlot != dstRegSlot)
    {
        AssertMsg(UNREACHED, "Arg count too big...");
        Fatal();
    }
    StackSym * symDst = nullptr;
    if (type == TyVar)
    {
        symDst = m_func->m_symTable->GetArgSlotSym(ArgSlotMath::Add(dstArgSlot, 1));
        IR::Opnd * tmpDst = IR::RegOpnd::New(StackSym::New(m_func), TyVar, m_func);

        IR::Instr * instr = IR::Instr::New(Js::OpCode::ToVar, tmpDst, srcOpnd, m_func);
        AddInstr(instr, offset);
        srcOpnd = tmpDst;
    }
    else
    {
        // Some arg types may use multiple slots, so can't rely on count from bytecode
        Assert(dstArgSlot >= m_argStack->Count());
        uint slotIndex = m_argStack->Count();
        AssertOrFailFast(slotIndex < UINT16_MAX);

        symDst = StackSym::NewArgSlotSym((Js::ArgSlot)slotIndex, m_func, type);
        symDst->m_allocated = true;
    }

    IR::Opnd * dstOpnd = IR::SymOpnd::New(symDst, type, m_func);
    if (!valueType.IsUninitialized())
    {
        dstOpnd->SetValueType(valueType);
    }

    IR::Instr * instr = IR::Instr::New(Js::OpCode::ArgOut_A, dstOpnd, srcOpnd, m_func);
    AddInstr(instr, offset);

    m_argStack->Push(instr);
}